

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic_simplification.cpp
# Opt level: O1

void __thiscall
duckdb::ArithmeticSimplificationRule::ArithmeticSimplificationRule
          (ArithmeticSimplificationRule *this,ExpressionRewriter *rewriter)

{
  _Head_base<0UL,_duckdb::FunctionMatcher_*,_false> _Var1;
  _Head_base<0UL,_duckdb::TypeMatcher_*,_false> _Var2;
  _Head_base<0UL,_duckdb::ExpressionMatcher_*,_false> _Var3;
  _Head_base<0UL,_duckdb::ExpressionMatcher_*,_false> _Var4;
  pointer pFVar5;
  _Head_base<0UL,_duckdb::FunctionMatcher_*,_false> _Var6;
  _Head_base<0UL,_duckdb::TypeMatcher_*,_false> _Var7;
  reference pvVar8;
  pointer pEVar9;
  long lVar10;
  templated_unique_single_t op;
  _Head_base<0UL,_duckdb::ExpressionMatcher_*,_false> local_130;
  undefined1 local_123;
  undefined1 local_122;
  undefined1 local_121;
  __uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>
  local_120 [2];
  undefined1 local_110 [16];
  undefined1 *local_100 [2];
  undefined1 local_f0 [16];
  undefined1 *local_e0 [2];
  undefined1 local_d0 [16];
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_a0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  (this->super_Rule).rewriter = rewriter;
  (this->super_Rule).root.
  super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl = (ExpressionMatcher *)0x0
  ;
  (this->super_Rule)._vptr_Rule = (_func_int **)&PTR__Rule_02493720;
  local_130._M_head_impl = (ExpressionMatcher *)operator_new(0x48);
  (local_130._M_head_impl)->expr_class = BOUND_FUNCTION;
  ((local_130._M_head_impl)->expr_type).
  super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl =
       (ExpressionTypeMatcher *)0x0;
  ((local_130._M_head_impl)->type).
  super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
  super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl = (TypeMatcher *)0x0;
  (local_130._M_head_impl)->_vptr_ExpressionMatcher =
       (_func_int **)&PTR__FunctionExpressionMatcher_024b4478;
  local_130._M_head_impl[1]._vptr_ExpressionMatcher = (_func_int **)0x0;
  *(undefined8 *)&local_130._M_head_impl[1].expr_class = 0;
  local_130._M_head_impl[1].expr_type.
  super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl =
       (ExpressionTypeMatcher *)0x0;
  local_130._M_head_impl[2]._vptr_ExpressionMatcher = (_func_int **)0x0;
  pFVar5 = unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                         *)&local_130);
  local_120[0]._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl =
       (tuple<duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>)
       operator_new(0x20);
  *(undefined1 *)
   ((long)local_120[0]._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
          .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl + 8) = 0x1f;
  *(long *)((long)local_120[0]._M_t.
                  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
                  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl + 0x10) =
       0;
  *(long *)((long)local_120[0]._M_t.
                  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
                  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl + 0x18) =
       0;
  *(undefined ***)
   local_120[0]._M_t.
   super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
   .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl =
       &PTR__ExpressionMatcher_02493c38;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
              *)&pFVar5->matchers,
             (unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)local_120);
  if ((_Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
       )local_120[0]._M_t.
        super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
        .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl !=
      (ExpressionMatcher *)0x0) {
    (**(code **)(*(long *)local_120[0]._M_t.
                          super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
                          .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl +
                8))();
  }
  pFVar5 = unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                         *)&local_130);
  local_120[0]._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl =
       (tuple<duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>)
       operator_new(0x20);
  *(undefined ***)
   local_120[0]._M_t.
   super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
   .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl =
       &PTR__ExpressionMatcher_024b42c0;
  *(undefined1 *)
   ((long)local_120[0]._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
          .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)local_120[0]._M_t.
                  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
                  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl + 0x10) =
       0;
  *(long *)((long)local_120[0]._M_t.
                  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
                  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl + 0x18) =
       0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
              *)&pFVar5->matchers,
             (unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)local_120);
  if ((_Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
       )local_120[0]._M_t.
        super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
        .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl !=
      (ExpressionMatcher *)0x0) {
    (**(code **)(*(long *)local_120[0]._M_t.
                          super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
                          .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl +
                8))();
  }
  pFVar5 = unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                         *)&local_130);
  pFVar5->policy = SOME;
  local_120[0]._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl =
       (tuple<duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>)
       local_110;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"+","");
  local_100[0] = local_f0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"-","");
  local_e0[0] = local_d0;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e0,anon_var_dwarf_63fca92 + 8,anon_var_dwarf_63fca92 + 9);
  local_c0[0] = local_b0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"//","");
  ::std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::_Hashtable<std::__cxx11::string_const*>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&local_a0,local_120,&local_a0,0,&local_121,&local_122,&local_123);
  _Var6._M_head_impl = (FunctionMatcher *)operator_new(0x40);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)&local_68,&local_a0);
  (_Var6._M_head_impl)->_vptr_FunctionMatcher = (_func_int **)&PTR__ManyFunctionMatcher_02493c78;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)(_Var6._M_head_impl + 1),&local_68,&local_68);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  pFVar5 = unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                         *)&local_130);
  _Var1._M_head_impl =
       (pFVar5->function).
       super_unique_ptr<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionMatcher_*,_std::default_delete<duckdb::FunctionMatcher>_>
       .super__Head_base<0UL,_duckdb::FunctionMatcher_*,_false>._M_head_impl;
  (pFVar5->function).
  super_unique_ptr<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::FunctionMatcher_*,_std::default_delete<duckdb::FunctionMatcher>_>.
  super__Head_base<0UL,_duckdb::FunctionMatcher_*,_false>._M_head_impl = _Var6._M_head_impl;
  if (_Var1._M_head_impl != (FunctionMatcher *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_FunctionMatcher[1])();
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_a0);
  lVar10 = 0;
  do {
    if (local_b0 + lVar10 != *(undefined1 **)((long)local_c0 + lVar10)) {
      operator_delete(*(undefined1 **)((long)local_c0 + lVar10));
    }
    lVar10 = lVar10 + -0x20;
  } while (lVar10 != -0x80);
  _Var7._M_head_impl = (TypeMatcher *)operator_new(8);
  (_Var7._M_head_impl)->_vptr_TypeMatcher = (_func_int **)&PTR__TypeMatcher_02493cc8;
  pFVar5 = unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                         *)&local_130);
  _Var2._M_head_impl =
       (pFVar5->super_ExpressionMatcher).type.
       super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
       super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
       super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl;
  (pFVar5->super_ExpressionMatcher).type.
  super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
  super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl = _Var7._M_head_impl;
  if (_Var2._M_head_impl != (TypeMatcher *)0x0) {
    (*(_Var2._M_head_impl)->_vptr_TypeMatcher[1])();
  }
  _Var7._M_head_impl = (TypeMatcher *)operator_new(8);
  (_Var7._M_head_impl)->_vptr_TypeMatcher = (_func_int **)&PTR__TypeMatcher_02493cc8;
  pFVar5 = unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                         *)&local_130);
  pvVar8 = vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_true>
           ::operator[](&pFVar5->matchers,0);
  pEVar9 = unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
           ::operator->(pvVar8);
  _Var2._M_head_impl =
       (pEVar9->type).
       super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
       super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
       super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl;
  (pEVar9->type).super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>.
  _M_t.super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
  super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl = _Var7._M_head_impl;
  if (_Var2._M_head_impl != (TypeMatcher *)0x0) {
    (*(_Var2._M_head_impl)->_vptr_TypeMatcher[1])();
  }
  _Var7._M_head_impl = (TypeMatcher *)operator_new(8);
  (_Var7._M_head_impl)->_vptr_TypeMatcher = (_func_int **)&PTR__TypeMatcher_02493cc8;
  pFVar5 = unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                         *)&local_130);
  pvVar8 = vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_true>
           ::operator[](&pFVar5->matchers,1);
  pEVar9 = unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
           ::operator->(pvVar8);
  _Var2._M_head_impl =
       (pEVar9->type).
       super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
       super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
       super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl;
  (pEVar9->type).super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>.
  _M_t.super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
  super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl = _Var7._M_head_impl;
  if (_Var2._M_head_impl != (TypeMatcher *)0x0) {
    (*(_Var2._M_head_impl)->_vptr_TypeMatcher[1])();
  }
  _Var4._M_head_impl = local_130._M_head_impl;
  local_130._M_head_impl = (ExpressionMatcher *)0x0;
  _Var3._M_head_impl =
       (this->super_Rule).root.
       super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
       .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl;
  (this->super_Rule).root.
  super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl = _Var4._M_head_impl;
  if (_Var3._M_head_impl != (ExpressionMatcher *)0x0) {
    (**(code **)((long)(_Var3._M_head_impl)->_vptr_ExpressionMatcher + 8))();
  }
  if (local_130._M_head_impl != (ExpressionMatcher *)0x0) {
    (*(local_130._M_head_impl)->_vptr_ExpressionMatcher[1])();
  }
  return;
}

Assistant:

ArithmeticSimplificationRule::ArithmeticSimplificationRule(ExpressionRewriter &rewriter) : Rule(rewriter) {
	// match on an OperatorExpression that has a ConstantExpression as child
	auto op = make_uniq<FunctionExpressionMatcher>();
	op->matchers.push_back(make_uniq<ConstantExpressionMatcher>());
	op->matchers.push_back(make_uniq<ExpressionMatcher>());
	op->policy = SetMatcher::Policy::SOME;
	// we only match on simple arithmetic expressions (+, -, *, /)
	op->function = make_uniq<ManyFunctionMatcher>(unordered_set<string> {"+", "-", "*", "//"});
	// and only with numeric results
	op->type = make_uniq<IntegerTypeMatcher>();
	op->matchers[0]->type = make_uniq<IntegerTypeMatcher>();
	op->matchers[1]->type = make_uniq<IntegerTypeMatcher>();
	root = std::move(op);
}